

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O3

int __thiscall
LASreadItemCompressed_GPSTIME11_v1::init(LASreadItemCompressed_GPSTIME11_v1 *this,EVP_PKEY_CTX *ctx)

{
  U64 UVar1;
  
  this->multi_extreme_counter = 0;
  this->last_gpstime_diff = 0;
  ArithmeticDecoder::initSymbolModel(this->dec,this->m_gpstime_multi,(U32 *)0x0);
  ArithmeticDecoder::initSymbolModel(this->dec,this->m_gpstime_0diff,(U32 *)0x0);
  IntegerCompressor::initDecompressor(this->ic_gpstime);
  UVar1 = *(U64 *)ctx;
  (this->last_gpstime).u64 = UVar1;
  return (int)CONCAT71((int7)(UVar1 >> 8),1);
}

Assistant:

BOOL LASreadItemCompressed_GPSTIME11_v1::init(const U8* item, U32& context)
{
  /* init state */
  last_gpstime_diff = 0;
  multi_extreme_counter = 0;

  /* init models and integer compressors */
  dec->initSymbolModel(m_gpstime_multi);
  dec->initSymbolModel(m_gpstime_0diff);
  ic_gpstime->initDecompressor();

  /* init last item */
  last_gpstime.u64 = *((const U64*)item);
  return TRUE;
}